

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

string * __thiscall
pstore::database::build_sync_name_abi_cxx11_
          (string *__return_storage_ptr__,database *this,header *header)

{
  uint128 val;
  ulong uVar1;
  base32 *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  uint128::uint128((uint128 *)&stack0xffffffffffffffd8,(uint8_t *)&(this->storage_).file_);
  val.v_._8_8_ = in_stack_ffffffffffffffe0;
  val.v_._0_8_ = in_stack_ffffffffffffffd8;
  base32::convert<pstore::uint128>(__return_storage_ptr__,in_stack_ffffffffffffffd8,val);
  uVar1 = 0x14;
  if (__return_storage_ptr__->_M_string_length < 0x14) {
    uVar1 = __return_storage_ptr__->_M_string_length;
  }
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string database::build_sync_name (header const & header) {
        auto name = base32::convert (uint128{header.a.id.array ()});
        name.erase (std::min (sync_name_length, name.length ()));
        return name;
    }